

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void plain_array_suite::pop_back(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  basic_iterator<int> first_end_03;
  basic_iterator<int> first_end_04;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin;
  void *pvVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_02;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin_03;
  reference piVar3;
  ulong uVar4;
  ulong uVar5;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  basic_iterator<int> first_begin_03;
  basic_iterator<int> first_begin_04;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_f1;
  vector<int,_std::allocator<int>_> local_f0;
  circular_view<int,_18446744073709551615UL> local_d8;
  int local_b8 [4];
  circular_view<int,_18446744073709551615UL> *local_a8;
  size_type sStack_a0;
  circular_view<int,_18446744073709551615UL> *local_98;
  size_type sStack_90;
  circular_view<int,_18446744073709551615UL> *local_88;
  size_type sStack_80;
  circular_view<int,_18446744073709551615UL> *local_78;
  size_type sStack_70;
  circular_view<int,_18446744073709551615UL> *local_68;
  size_type sStack_60;
  circular_view<int,_18446744073709551615UL> *local_58;
  size_type sStack_50;
  type local_48 [6];
  
  local_d8.member.data = local_48;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_d8.member.cap = 4;
  local_d8.member.size = 0;
  local_d8.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_d8,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_d8);
  *piVar3 = 0xb;
  local_b8[0] = 0xb;
  __l._M_len = 1;
  __l._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l,&local_f1);
  uVar1 = local_d8.member.cap * 2;
  uVar4 = uVar1 - (local_d8.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    uVar5 = uVar1 - 1 & local_d8.member.next - local_d8.member.size;
  }
  else {
    uVar5 = (local_d8.member.next - local_d8.member.size) % uVar1;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    sStack_50 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    sStack_50 = local_d8.member.next % uVar1;
  }
  second_begin._M_current._4_4_ =
       local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._4_4_;
  second_begin._M_current._0_4_ =
       (int)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  first_end.current = sStack_50;
  first_end.parent = &local_d8;
  first_begin.current = uVar5;
  first_begin.parent = &local_d8;
  local_58 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x602,"void plain_array_suite::pop_back()",first_begin,first_end,second_begin,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  pvVar2 = (void *)CONCAT44(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_d8);
  vista::circular_view<int,_18446744073709551615UL>::remove_back(&local_d8,1);
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = *piVar3;
  local_b8[0] = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.pop_back()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x604,"void plain_array_suite::pop_back()",&local_f0,local_b8);
  uVar1 = local_d8.member.cap * 2;
  uVar4 = uVar1 - (local_d8.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    uVar5 = uVar1 - 1 & local_d8.member.next - local_d8.member.size;
  }
  else {
    uVar5 = (local_d8.member.next - local_d8.member.size) % uVar1;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    sStack_60 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    sStack_60 = local_d8.member.next % uVar1;
  }
  first_end_00.current = sStack_60;
  first_end_00.parent = &local_d8;
  first_begin_00.current = uVar5;
  first_begin_00.parent = &local_d8;
  local_68 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x608,"void plain_array_suite::pop_back()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_d8,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_d8);
  *piVar3 = 0xb;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_d8,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_d8);
  *piVar3 = 0x16;
  local_b8[0] = 0xb;
  local_b8[1] = 0x16;
  __l_00._M_len = 2;
  __l_00._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_00,&local_f1);
  uVar1 = local_d8.member.cap * 2;
  uVar4 = uVar1 - (local_d8.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    uVar5 = uVar1 - 1 & local_d8.member.next - local_d8.member.size;
  }
  else {
    uVar5 = (local_d8.member.next - local_d8.member.size) % uVar1;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    sStack_70 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    sStack_70 = local_d8.member.next % uVar1;
  }
  second_begin_00._M_current._4_4_ =
       local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._4_4_;
  second_begin_00._M_current._0_4_ =
       (int)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  first_end_01.current = sStack_70;
  first_end_01.parent = &local_d8;
  first_begin_01.current = uVar5;
  first_begin_01.parent = &local_d8;
  local_78 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x60f,"void plain_array_suite::pop_back()",first_begin_01,first_end_01,second_begin_00
             ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
              local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish);
  pvVar2 = (void *)CONCAT44(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_d8);
  vista::circular_view<int,_18446744073709551615UL>::remove_back(&local_d8,1);
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = *piVar3;
  local_b8[0] = 0x16;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.pop_back()","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x611,"void plain_array_suite::pop_back()",&local_f0,local_b8);
  local_b8[0] = 0xb;
  __l_01._M_len = 1;
  __l_01._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_01,&local_f1);
  uVar1 = local_d8.member.cap * 2;
  uVar4 = uVar1 - (local_d8.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    uVar5 = uVar1 - 1 & local_d8.member.next - local_d8.member.size;
  }
  else {
    uVar5 = (local_d8.member.next - local_d8.member.size) % uVar1;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    sStack_80 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    sStack_80 = local_d8.member.next % uVar1;
  }
  second_begin_01._M_current._4_4_ =
       local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._4_4_;
  second_begin_01._M_current._0_4_ =
       (int)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  first_end_02.current = sStack_80;
  first_end_02.parent = &local_d8;
  first_begin_02.current = uVar5;
  first_begin_02.parent = &local_d8;
  local_88 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x615,"void plain_array_suite::pop_back()",first_begin_02,first_end_02,second_begin_01
             ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
              local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish);
  pvVar2 = (void *)CONCAT44(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_d8,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_d8);
  *piVar3 = 0x21;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_d8,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_d8);
  *piVar3 = 0x2c;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_d8,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_d8);
  *piVar3 = 0x37;
  local_b8[0] = 0xb;
  local_b8[1] = 0x21;
  local_b8[2] = 0x2c;
  local_b8[3] = 0x37;
  __l_02._M_len = 4;
  __l_02._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_02,&local_f1);
  uVar1 = local_d8.member.cap * 2;
  uVar4 = uVar1 - (local_d8.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    uVar5 = uVar1 - 1 & local_d8.member.next - local_d8.member.size;
  }
  else {
    uVar5 = (local_d8.member.next - local_d8.member.size) % uVar1;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    sStack_90 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    sStack_90 = local_d8.member.next % uVar1;
  }
  second_begin_02._M_current._4_4_ =
       local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._4_4_;
  second_begin_02._M_current._0_4_ =
       (int)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  first_end_03.current = sStack_90;
  first_end_03.parent = &local_d8;
  first_begin_03.current = uVar5;
  first_begin_03.parent = &local_d8;
  local_98 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x61d,"void plain_array_suite::pop_back()",first_begin_03,first_end_03,second_begin_02
             ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
              local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish);
  pvVar2 = (void *)CONCAT44(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_d8);
  vista::circular_view<int,_18446744073709551615UL>::remove_back(&local_d8,1);
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = *piVar3;
  local_b8[0] = 0x37;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.pop_back()","55",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x61f,"void plain_array_suite::pop_back()",&local_f0,local_b8);
  local_b8[0] = 0xb;
  local_b8[1] = 0x21;
  local_b8[2] = 0x2c;
  __l_03._M_len = 3;
  __l_03._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_03,&local_f1);
  uVar1 = local_d8.member.cap * 2;
  uVar4 = uVar1 - (local_d8.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    uVar5 = uVar1 - 1 & local_d8.member.next - local_d8.member.size;
  }
  else {
    uVar5 = (local_d8.member.next - local_d8.member.size) % uVar1;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    sStack_a0 = uVar1 - 1 & local_d8.member.next;
  }
  else {
    sStack_a0 = local_d8.member.next % uVar1;
  }
  second_begin_03._M_current._4_4_ =
       local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start._4_4_;
  second_begin_03._M_current._0_4_ =
       (int)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  first_end_04.current = sStack_a0;
  first_end_04.parent = &local_d8;
  first_begin_04.current = uVar5;
  first_begin_04.parent = &local_d8;
  local_a8 = &local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x623,"void plain_array_suite::pop_back()",first_begin_04,first_end_04,second_begin_03
             ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
              local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish);
  pvVar2 = (void *)CONCAT44(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  return;
}

Assistant:

void pop_back()
{
    int array[4] = {};
    circular_view<int> span(array);
    span.push_back(11);
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    BOOST_TEST_EQ(span.pop_back(), 11);
    {
        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(11);
    span.push_back(22);
    {
        std::vector<int> expect = { 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    BOOST_TEST_EQ(span.pop_back(), 22);
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(33);
    span.push_back(44);
    span.push_back(55);
    {
        std::vector<int> expect = { 11, 33, 44, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    BOOST_TEST_EQ(span.pop_back(), 55);
    {
        std::vector<int> expect = { 11, 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}